

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentInvoker.h
# Opt level: O0

int __thiscall
aeron::concurrent::AgentInvoker<aeron::ClientConductor>::invoke
          (AgentInvoker<aeron::ClientConductor> *this)

{
  SourcedException *exception;
  int local_14;
  int workCount;
  AgentInvoker<aeron::ClientConductor> *this_local;
  
  local_14 = 0;
  if ((this->m_isRunning & 1U) != 0) {
    local_14 = ClientConductor::doWork(this->m_agent);
  }
  return local_14;
}

Assistant:

inline int invoke()
    {
        int workCount = 0;

        if (m_isRunning)
        {
            try
            {
                workCount = m_agent.doWork();
            }
            catch (const util::SourcedException &exception)
            {
                m_exceptionHandler(exception);
            }
        }

        return workCount;
    }